

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O3

ES5HeapArgumentsObject * __thiscall
Js::HeapArgumentsObject::ConvertToUnmappedArgumentsObject
          (HeapArgumentsObject *this,bool overwriteArgsUsingFrameObject)

{
  uint32 index;
  
  ConvertToES5HeapArgumentsObject(this,overwriteArgsUsingFrameObject);
  if (this->formalCount != 0) {
    index = 0;
    do {
      if ((*(uint *)&this->field_0x20 & 0x7fffffff) <= index) {
        return (ES5HeapArgumentsObject *)this;
      }
      ES5HeapArgumentsObject::DisconnectFormalFromNamedArgument
                ((ES5HeapArgumentsObject *)this,index);
      index = index + 1;
    } while (index < this->formalCount);
  }
  return (ES5HeapArgumentsObject *)this;
}

Assistant:

ES5HeapArgumentsObject* HeapArgumentsObject::ConvertToUnmappedArgumentsObject(bool overwriteArgsUsingFrameObject)
    {
        ES5HeapArgumentsObject* es5ArgsObj = ConvertToES5HeapArgumentsObject(overwriteArgsUsingFrameObject);

        for (uint i=0; i<this->formalCount && i<numOfArguments; ++i)
        {
            es5ArgsObj->DisconnectFormalFromNamedArgument(i);
        }

        return es5ArgsObj;
    }